

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAndAbs.c
# Opt level: O2

DdNode * cuddBddAndAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  DdNode *cube_00;
  int iVar5;
  DdNode *pDVar6;
  long lVar7;
  DdNode *g_00;
  uint *puVar8;
  DdNode *pDVar9;
  DdHalfWord *pDVar10;
  DdNode *pDVar11;
  uint *puVar12;
  uint index;
  uint uVar13;
  DdNode *local_50;
  timespec local_40;
  
  pDVar6 = manager->one;
  pDVar11 = (DdNode *)((ulong)pDVar6 ^ 1);
  if (((((DdNode *)((ulong)g ^ 1) == f) || (pDVar11 == f)) || (pDVar11 == g)) ||
     (pDVar11 = pDVar6, pDVar6 == g && pDVar6 == f)) {
    return pDVar11;
  }
  if (pDVar6 != cube) {
    pDVar11 = g;
    if ((f == g || pDVar6 == f) || (pDVar11 = f, pDVar6 == g)) {
      pDVar6 = cuddBddExistAbstractRecur(manager,pDVar11,cube);
      return pDVar6;
    }
    if (g < f) {
      pDVar11 = g;
      g = f;
    }
    f = pDVar11;
    puVar8 = (uint *)((ulong)f & 0xfffffffffffffffe);
    puVar12 = (uint *)((ulong)g & 0xfffffffffffffffe);
    piVar4 = manager->perm;
    uVar1 = piVar4[*puVar8];
    uVar2 = piVar4[*puVar12];
    uVar13 = uVar1;
    if (uVar2 < uVar1) {
      uVar13 = uVar2;
    }
    do {
      uVar3 = piVar4[cube->index];
      if (uVar13 <= uVar3) {
        if (((puVar8[1] != 1) || (puVar12[1] != 1)) &&
           (pDVar11 = cuddCacheLookup(manager,6,f,g,cube), pDVar11 != (DdNode *)0x0)) {
          return pDVar11;
        }
        if (manager->TimeStop != 0) {
          iVar5 = clock_gettime(3,&local_40);
          if (iVar5 < 0) {
            lVar7 = -1;
          }
          else {
            lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          if (manager->TimeStop < lVar7) {
            return (DdNode *)0x0;
          }
        }
        if (uVar2 < uVar1) {
          index = *puVar12;
          pDVar11 = f;
          local_50 = f;
        }
        else {
          index = *puVar8;
          pDVar11 = *(DdNode **)(puVar8 + 4);
          local_50 = *(DdNode **)(puVar8 + 6);
          if (((ulong)f & 1) != 0) {
            pDVar11 = (DdNode *)((ulong)pDVar11 ^ 1);
            local_50 = (DdNode *)((ulong)local_50 ^ 1);
          }
        }
        g_00 = g;
        pDVar9 = g;
        if (uVar2 <= uVar1) {
          pDVar9 = *(DdNode **)(puVar12 + 4);
          g_00 = *(DdNode **)(puVar12 + 6);
          if (((ulong)g & 1) != 0) {
            pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
            g_00 = (DdNode *)((ulong)g_00 ^ 1);
          }
        }
        if (uVar3 == uVar13) {
          cube_00 = (cube->type).kids.T;
          pDVar11 = cuddBddAndAbstractRecur(manager,pDVar11,pDVar9,cube_00);
          if (pDVar11 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          if (((pDVar11 == pDVar6) || (pDVar11 == local_50)) || (pDVar11 == g_00))
          goto LAB_00662908;
          piVar4 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
          *piVar4 = *piVar4 + 1;
          pDVar6 = g_00;
          if ((pDVar11 == (DdNode *)((ulong)local_50 ^ 1)) ||
             (pDVar6 = local_50, pDVar11 == (DdNode *)((ulong)g_00 ^ 1))) {
            pDVar6 = cuddBddExistAbstractRecur(manager,pDVar6,cube_00);
          }
          else {
            pDVar6 = cuddBddAndAbstractRecur(manager,local_50,g_00,cube_00);
          }
          if (pDVar6 == (DdNode *)0x0) goto LAB_006628ec;
          if (pDVar11 == pDVar6) {
            pDVar10 = (DdHalfWord *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
          }
          else {
            piVar4 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar9 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar11 ^ 1),
                                     (DdNode *)((ulong)pDVar6 ^ 1));
            if (pDVar9 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,pDVar11);
              pDVar11 = pDVar6;
              goto LAB_006628ec;
            }
            piVar4 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar10 = (DdHalfWord *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
            Cudd_DelayedDerefBdd(manager,pDVar11);
            Cudd_DelayedDerefBdd(manager,pDVar6);
            pDVar11 = (DdNode *)((ulong)pDVar9 ^ 1);
          }
        }
        else {
          pDVar11 = cuddBddAndAbstractRecur(manager,pDVar11,pDVar9,cube);
          if (pDVar11 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          pDVar9 = (DdNode *)((ulong)pDVar11 & 0xfffffffffffffffe);
          pDVar9->ref = pDVar9->ref + 1;
          pDVar6 = cuddBddAndAbstractRecur(manager,local_50,g_00,cube);
          if (pDVar6 == (DdNode *)0x0) goto LAB_006628ec;
          pDVar10 = &pDVar9->ref;
          if (pDVar11 != pDVar6) {
            piVar4 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            if (((ulong)pDVar11 & 1) == 0) {
              pDVar9 = cuddUniqueInter(manager,index,pDVar11,pDVar6);
              if (pDVar9 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar11);
                pDVar11 = pDVar6;
                goto LAB_006628ec;
              }
            }
            else {
              pDVar9 = cuddUniqueInter(manager,index,pDVar9,(DdNode *)((ulong)pDVar6 ^ 1));
              if (pDVar9 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar11);
                pDVar11 = pDVar6;
LAB_006628ec:
                Cudd_IterDerefBdd(manager,pDVar11);
                return (DdNode *)0x0;
              }
              pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
            }
            piVar4 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + -1;
            pDVar11 = pDVar9;
          }
        }
        *pDVar10 = *pDVar10 - 1;
LAB_00662908:
        if ((puVar8[1] == 1) && (puVar12[1] == 1)) {
          return pDVar11;
        }
        cuddCacheInsert(manager,6,f,g,cube,pDVar11);
        return pDVar11;
      }
      cube = (cube->type).kids.T;
    } while (cube != pDVar6);
  }
  pDVar6 = cuddBddAndRecur(manager,f,g);
  return pDVar6;
}

Assistant:

DdNode *
cuddBddAndAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == one && g == one)   return(one);

    if (cube == one) {
        return(cuddBddAndRecur(manager, f, g));
    }
    if (f == one || f == g) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }
    /* At this point f, g, and cube are not constant. */

    if (f > g) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    while (topcube < top) {
        cube = cuddT(cube);
        if (cube == one) {
            return(cuddBddAndRecur(manager, f, g));
        }
        topcube = manager->perm[cube->index];
    }
    /* Now, topcube >= top. */

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube);
        if (r != NULL) {
            return(r);
        }
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    if (topf == top) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg == top) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    if (topcube == top) {       /* quantify */
        DdNode *Cube = cuddT(cube);
        t = cuddBddAndAbstractRecur(manager, ft, gt, Cube);
        if (t == NULL) return(NULL);
        /* Special case: 1 OR anything = 1. Hence, no need to compute
        ** the else branch if t is 1. Likewise t + t * anything == t.
        ** Notice that t == fe implies that fe does not depend on the
        ** variables in Cube. Likewise for t == ge.
        */
        if (t == one || t == fe || t == ge) {
            if (F->ref != 1 || G->ref != 1)
                cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG,
                                f, g, cube, t);
            return(t);
        }
        cuddRef(t);
        /* Special case: t + !t * anything == t + anything. */
        if (t == Cudd_Not(fe)) {
            e = cuddBddExistAbstractRecur(manager, ge, Cube);
        } else if (t == Cudd_Not(ge)) {
            e = cuddBddExistAbstractRecur(manager, fe, Cube);
        } else {
            e = cuddBddAndAbstractRecur(manager, fe, ge, Cube);
        }
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
            cuddRef(r);
            Cudd_DelayedDerefBdd(manager, t);
            Cudd_DelayedDerefBdd(manager, e);
            cuddDeref(r);
        }
    } else {
        t = cuddBddAndAbstractRecur(manager, ft, gt, cube);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddBddAndAbstractRecur(manager, fe, ge, cube);
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            if (Cudd_IsComplement(t)) {
                r = cuddUniqueInter(manager, (int) index,
                                    Cudd_Not(t), Cudd_Not(e));
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = cuddUniqueInter(manager,(int)index,t,e);
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
            }
            cuddDeref(e);
            cuddDeref(t);
        }
    }

    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}